

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

void __thiscall Matrix<int>::transpose(Matrix<int> *this)

{
  value_type vVar1;
  size_type *psVar2;
  reference pvVar3;
  reference __b;
  ulong local_68;
  size_type j_1;
  size_type i_1;
  Matrix<int> t;
  size_type j;
  size_type i;
  Matrix<int> *this_local;
  
  if (*this->num_rows == *this->num_cols) {
    for (j = 0; psVar2 = (size_type *)j, j < *this->num_rows; j = j + 1) {
      while (t.num_cols = (size_type *)((long)psVar2 + 1), t.num_cols < (size_type *)*this->num_cols
            ) {
        pvVar3 = at(this,j,(size_type)t.num_cols);
        __b = at(this,(size_type)t.num_cols,j);
        std::swap<int>(pvVar3,__b);
        psVar2 = t.num_cols;
      }
    }
  }
  else {
    Matrix((Matrix<int> *)&i_1,*this->num_cols,*this->num_rows);
    for (j_1 = 0; j_1 < *this->num_rows; j_1 = j_1 + 1) {
      for (local_68 = 0; local_68 < *this->num_cols; local_68 = local_68 + 1) {
        pvVar3 = at(this,j_1,local_68);
        vVar1 = *pvVar3;
        pvVar3 = at((Matrix<int> *)&i_1,local_68,j_1);
        *pvVar3 = vVar1;
      }
    }
    std::swap<int,std::allocator<int>>(&this->data_,(vector<int,_std::allocator<int>_> *)&i_1);
    ~Matrix((Matrix<int> *)&i_1);
  }
  std::swap<unsigned_long>(&this->rows_,&this->cols_);
  return;
}

Assistant:

void transpose(){
    // if matrix is square, no extra memory is needed to build its transpose
    if (num_rows == num_cols){
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {i + 1}; j < num_cols; j++){
          std::swap(at(i, j), at(j, i));
        }
      }
    }
    // if matrix is not square, some extra memory is needed to build
    // its transpose
    else{
      // auxiliar memory to temporarily hold the transpose
      Matrix<Type> t {num_cols, num_rows};
      // builds transpose
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {0}; j < num_cols; j++){
          t.at(j, i) = at(i, j);
        }
      }
      // exchanges matrix data with t data, which is about to die
      std::swap(data_, t.data_);
    }
    // exchanges number of rows and columns
    std::swap(rows_, cols_);
  }